

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmem.c
# Opt level: O3

ppointer p_realloc(ppointer mem,psize n_bytes)

{
  ppointer pvVar1;
  
  if (n_bytes == 0) {
    return (ppointer)0x0;
  }
  if (mem != (ppointer)0x0) {
    pvVar1 = (ppointer)(*p_mem_table_1)();
    return pvVar1;
  }
  pvVar1 = (ppointer)(*p_mem_table_0)(n_bytes);
  return pvVar1;
}

Assistant:

P_LIB_API ppointer
p_realloc (ppointer mem, psize n_bytes)
{
	if (P_UNLIKELY (n_bytes == 0))
		return NULL;

	if (P_UNLIKELY (mem == NULL))
		return p_mem_table.f_malloc (n_bytes);
	else
		return p_mem_table.f_realloc (mem, n_bytes);
}